

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

void xmlXPtrLocationSetRemove(xmlLocationSetPtr cur,int val)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if ((cur != (xmlLocationSetPtr)0x0) && (val < cur->locNr)) {
    lVar2 = (long)cur->locNr + -1;
    iVar1 = (int)lVar2;
    cur->locNr = iVar1;
    if (val < iVar1) {
      lVar3 = (long)val;
      do {
        cur->locTab[lVar3] = cur->locTab[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    cur->locTab[iVar1] = (xmlXPathObjectPtr)0x0;
  }
  return;
}

Assistant:

void
xmlXPtrLocationSetRemove(xmlLocationSetPtr cur, int val) {
    if (cur == NULL) return;
    if (val >= cur->locNr) return;
    cur->locNr--;
    for (;val < cur->locNr;val++)
        cur->locTab[val] = cur->locTab[val + 1];
    cur->locTab[cur->locNr] = NULL;
}